

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

idx_t duckdb::BitStringAggOperation::GetRange<unsigned_short>(unsigned_short min,unsigned_short max)

{
  bool bVar1;
  idx_t iVar2;
  InvalidInputException *this;
  unsigned_short result;
  string local_48;
  
  if (min <= max) {
    bVar1 = duckdb::TrySubtractOperator::Operation<unsigned_short,unsigned_short,unsigned_short>
                      (max,min,(ushort *)&local_48);
    iVar2 = 0xffffffffffffffff;
    if (bVar1) {
      iVar2 = ((ulong)local_48._M_dataplus._M_p & 0xffff) + 1;
    }
    return iVar2;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Invalid explicit bitstring range: Minimum (%d) > maximum (%d)","")
  ;
  InvalidInputException::InvalidInputException<unsigned_short,unsigned_short>
            (this,&local_48,min,max);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static idx_t GetRange(INPUT_TYPE min, INPUT_TYPE max) {
		if (min > max) {
			throw InvalidInputException("Invalid explicit bitstring range: Minimum (%d) > maximum (%d)", min, max);
		}
		INPUT_TYPE result;
		if (!TrySubtractOperator::Operation(max, min, result)) {
			return NumericLimits<idx_t>::Maximum();
		}
		auto val = NumericCast<idx_t>(result);
		if (val == NumericLimits<idx_t>::Maximum()) {
			return val;
		}
		return val + 1;
	}